

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

shared_ptr<aeron::ExclusivePublication> __thiscall
aeron::archive::AeronArchive::addRecordedExclusivePublication
          (AeronArchive *this,string *channel,int32_t streamId)

{
  long lVar1;
  int32_t in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<aeron::ExclusivePublication> sVar2;
  undefined1 local_50 [32];
  
  ClientConductor::addExclusivePublication
            ((ClientConductor *)(channel[9]._M_string_length + 0x24b0),
             (string *)CONCAT44(in_register_00000014,streamId),in_ECX);
  (this->ctx_).cfg_.messageTimeoutNs = 0;
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)0x0;
  while( true ) {
    ClientConductor::findExclusivePublication
              ((ClientConductor *)local_50,channel[9]._M_string_length + 0x24b0);
    std::__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    lVar1 = (this->ctx_).cfg_.messageTimeoutNs;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    if (lVar1 != 0) break;
    sched_yield();
  }
  ChannelUri::addSessionId
            ((string *)local_50,(string *)CONCAT44(in_register_00000014,streamId),
             *(int32_t *)((this->ctx_).cfg_.messageTimeoutNs + 0x54));
  startRecording((AeronArchive *)channel,(string *)local_50,in_ECX,LOCAL);
  std::__cxx11::string::~string((string *)local_50);
  sVar2.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::ExclusivePublication>)
         sVar2.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::ExclusivePublication> AeronArchive::addRecordedExclusivePublication(const std::string& channel,
                                                                                           std::int32_t streamId) {
    std::int64_t pubId = aeron_->addExclusivePublication(channel, streamId);
    std::shared_ptr<aeron::ExclusivePublication> publication;
    while (!(publication = aeron_->findExclusivePublication(pubId))) {
        std::this_thread::yield();
    }

    startRecording(ChannelUri::addSessionId(channel, publication->sessionId()), streamId,
                   codecs::SourceLocation::LOCAL);

    return publication;
}